

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,-1,1,true>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                 *xpr)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar1 = (xpr->m_rhs).
          super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.
          m_rows.m_value;
  uVar4 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar4 = uVar1;
  }
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.
           super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
           .
           super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
           .m_argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
           .
           super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
           .m_data;
  pdVar3 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
           .super_block_evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (uVar1 + 1 < 3) {
    dVar7 = *pdVar2 * *pdVar3;
    if (1 < (long)uVar1) {
      uVar4 = 1;
      do {
        dVar7 = dVar7 + pdVar2[uVar4] * pdVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    uVar5 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    dVar10 = *pdVar3 * *pdVar2;
    dVar7 = pdVar3[1] * pdVar2[1];
    if (3 < (long)uVar1) {
      uVar4 = uVar4 & 0xfffffffffffffffc;
      dVar8 = pdVar3[2] * pdVar2[2];
      dVar9 = pdVar3[3] * pdVar2[3];
      if (7 < (long)uVar1) {
        lVar6 = 4;
        do {
          dVar10 = dVar10 + pdVar3[lVar6] * pdVar2[lVar6];
          dVar7 = dVar7 + (pdVar3 + lVar6)[1] * (pdVar2 + lVar6)[1];
          dVar8 = dVar8 + pdVar3[lVar6 + 2] * pdVar2[lVar6 + 2];
          dVar9 = dVar9 + (pdVar3 + lVar6 + 2)[1] * (pdVar2 + lVar6 + 2)[1];
          lVar6 = lVar6 + 4;
        } while (lVar6 < (long)uVar4);
      }
      dVar10 = dVar8 + dVar10;
      dVar7 = dVar9 + dVar7;
      if ((long)uVar4 < (long)uVar5) {
        dVar10 = dVar10 + pdVar3[uVar4] * pdVar2[uVar4];
        dVar7 = dVar7 + (pdVar3 + uVar4)[1] * (pdVar2 + uVar4)[1];
      }
    }
    dVar7 = dVar7 + dVar10;
    if ((long)uVar5 < (long)uVar1) {
      do {
        dVar7 = dVar7 + pdVar2[uVar5] * pdVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  return dVar7;
}

Assistant:

operator T() const { return m_value; }